

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<true,_true,_true>::fix_
          (DaTrie<true,_true,_true> *this,uint32_t node_pos,
          vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *blocks)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  reference pvVar4;
  reference this_00;
  vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *in_RDX;
  uint in_ESI;
  DaTrie<true,_true,_true> *in_RDI;
  uint32_t prev;
  uint32_t next;
  uint32_t block_pos;
  uint32_t in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar1 = in_ESI >> 8;
  while (uVar2 = num_blocks((DaTrie<true,_true,_true> *)0x17c691), uVar2 <= uVar1) {
    push_block_((DaTrie<true,_true,_true> *)blocks);
  }
  in_RDI->bc_emps_ = in_RDI->bc_emps_ - 1;
  pvVar4 = std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::operator[]
                     (in_RDX,(ulong)uVar1);
  pvVar4->num_emps = pvVar4->num_emps - 1;
  pvVar4 = std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::operator[]
                     (in_RDX,(ulong)uVar1);
  if (pvVar4->num_emps == 0) {
    delete_block_link_((DaTrie<true,_true,_true> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                       (uint32_t)((ulong)in_RDX >> 0x20),
                       (vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)
                       CONCAT44(uVar1,in_stack_ffffffffffffffe0));
    uVar2 = in_ESI;
  }
  else {
    uVar3 = next_(in_RDI,in_stack_ffffffffffffffcc);
    prev_(in_RDI,in_stack_ffffffffffffffcc);
    set_next_(in_RDI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    set_prev_(in_RDI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    uVar2 = in_ESI;
    pvVar4 = std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::operator[]
                       (in_RDX,(ulong)uVar1);
    if (in_ESI == pvVar4->head) {
      pvVar4 = std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::operator[]
                         (in_RDX,(ulong)uVar1);
      pvVar4->head = uVar3;
    }
  }
  this_00 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](&in_RDI->bc_,(ulong)uVar2);
  Bc::fix(this_00);
  return;
}

Assistant:

void fix_(uint32_t node_pos, std::vector<BlockLink>& blocks) {
    auto block_pos = node_pos / BLOCK_SIZE;
    while (num_blocks() <= block_pos) {
      push_block_();
    }

    assert(node_pos < bc_.size());
    assert(!bc_[node_pos].is_fixed());

    --bc_emps_;
    --blocks[block_pos].num_emps;

    if (blocks[block_pos].num_emps == 0) {
      delete_block_link_(block_pos, blocks_);
    } else {
      auto next = next_(node_pos);
      auto prev = prev_(node_pos);
      set_next_(prev, next);
      set_prev_(next, prev);
      if (node_pos == blocks[block_pos].head) {
        blocks[block_pos].head = next;
      }
    }
    bc_[node_pos].fix();
  }